

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall Runtime::popVarEnv(Runtime *this)

{
  VarEnv *this_00;
  reference ppVVar1;
  _Fwd_list_iterator<VarEnv_*> local_20;
  _Fwd_list_iterator<VarEnv_*> local_18;
  Runtime *local_10;
  Runtime *this_local;
  
  local_10 = this;
  local_18._M_node =
       (_Fwd_list_node_base *)
       std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::begin(&this->varEnvs);
  ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&local_18);
  if (*ppVVar1 != (VarEnv *)0x0) {
    local_20._M_node =
         (_Fwd_list_node_base *)
         std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::begin(&this->varEnvs);
    ppVVar1 = std::_Fwd_list_iterator<VarEnv_*>::operator*(&local_20);
    this_00 = *ppVVar1;
    if (this_00 != (VarEnv *)0x0) {
      VarEnv::~VarEnv(this_00);
      operator_delete(this_00);
    }
  }
  std::forward_list<VarEnv_*,_std::allocator<VarEnv_*>_>::pop_front(&this->varEnvs);
  return;
}

Assistant:

void Runtime::popVarEnv() {
    if ((*(varEnvs.begin())) != NULL) {
        delete (*(varEnvs.begin()));
    }
    varEnvs.pop_front();
}